

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_fourier_transform_cepstral_analysis.h
# Opt level: O0

void __thiscall sptk::FastFourierTransformCepstralAnalysis::Buffer::~Buffer(Buffer *this)

{
  Buffer *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  in_RDI->_vptr_Buffer = (_func_int **)&PTR__Buffer_00132750;
  RealValuedInverseFastFourierTransform::Buffer::~Buffer((Buffer *)0x1075aa);
  RealValuedFastFourierTransform::Buffer::~Buffer(in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

virtual ~Buffer() {
    }